

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAuto.c
# Opt level: O3

void Abc_NtkAutoPrint(Abc_Ntk_t *pNtk,int Output,int fNaive,int fVerbose)

{
  int iVar1;
  DdManager *dd;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint nvars;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  uint *__ptr;
  undefined8 uVar12;
  char **__ptr_00;
  DdNode *pDVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  DdNode *n;
  ulong uVar17;
  long lVar18;
  Vec_Ptr_t *pVVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  double dVar23;
  timespec ts;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  long local_68;
  timespec local_48;
  char **local_38;
  
  pvVar11 = Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
  if (pvVar11 != (void *)0x0) {
    if (pNtk->vAttrs->nSize < 8) {
LAB_00296654:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pVVar19 = pNtk->vCos;
    uVar7 = pNtk->vCis->nSize;
    uVar8 = pVVar19->nSize;
    dd = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
    __ptr = (uint *)malloc(0x10);
    uVar17 = 8;
    if (6 < uVar8 - 1) {
      uVar17 = (ulong)uVar8;
    }
    __ptr[1] = 0;
    uVar4 = (uint)uVar17;
    *__ptr = uVar4;
    if (uVar4 == 0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc((long)(int)uVar4 << 3);
    }
    *(void **)(__ptr + 2) = pvVar11;
    if (0 < (int)uVar8) {
      lVar18 = 0;
      do {
        lVar21 = *(long *)(*pVVar19->pArray[lVar18] + 0x1b0);
        if (*(int *)(lVar21 + 4) < 8) goto LAB_00296654;
        piVar2 = *(int **)(*(long *)(lVar21 + 8) + 0x38);
        pvVar11 = *(void **)(piVar2 + 2);
        if (pvVar11 == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar6 = (int)*(long *)((long)pVVar19->pArray[lVar18] + 0x10);
        lVar21 = (long)iVar6;
        iVar1 = *piVar2;
        if (iVar1 <= iVar6) {
          iVar22 = iVar6 + 10;
          if (iVar6 < iVar1 * 2) {
            iVar22 = iVar1 * 2;
          }
          if (iVar1 < iVar22) {
            pvVar11 = realloc(pvVar11,(long)iVar22 * 8);
            *(void **)(piVar2 + 2) = pvVar11;
            memset((void *)((long)pvVar11 + (long)*piVar2 * 8),0,((long)iVar22 - (long)*piVar2) * 8)
            ;
            *piVar2 = iVar22;
          }
        }
        lVar20 = *(long *)((long)pvVar11 + lVar21 * 8);
        if (lVar20 == 0) {
          if (*(code **)(piVar2 + 8) == (code *)0x0) {
            lVar20 = 0;
          }
          else {
            uVar12 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
            *(undefined8 *)(*(long *)(piVar2 + 2) + lVar21 * 8) = uVar12;
            lVar20 = *(long *)(*(long *)(piVar2 + 2) + lVar21 * 8);
          }
        }
        iVar6 = (int)uVar17;
        if ((int)lVar18 == iVar6) {
          if (iVar6 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc(0x80);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar11;
            *__ptr = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar17 = (ulong)(uint)(iVar6 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc(uVar17 * 8);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),uVar17 * 8);
            }
            *(void **)(__ptr + 2) = pvVar11;
            *__ptr = iVar6 * 2;
          }
        }
        else {
          pvVar11 = *(void **)(__ptr + 2);
        }
        lVar21 = lVar18 + 1;
        __ptr[1] = (uint)lVar21;
        *(long *)((long)pvVar11 + lVar18 * 8) = lVar20;
        pVVar19 = pNtk->vCos;
        lVar18 = lVar21;
      } while (lVar21 < pVVar19->nSize);
      pvVar11 = *(void **)(__ptr + 2);
    }
    local_38 = Abc_NtkCollectCioNames(pNtk,0);
    __ptr_00 = Abc_NtkCollectCioNames(pNtk,1);
    if (fVerbose != 0) {
      uVar4 = Cudd_ReadKeys(dd);
      uVar5 = Cudd_ReadDead(dd);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar4 - uVar5));
    }
    uVar17 = (ulong)uVar7;
    if (0 < (int)uVar7) {
      do {
        Cudd_bddNewVar(dd);
        uVar4 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    iVar6 = Cudd_ReadSize(dd);
    if (iVar6 != uVar7 * 2) {
      __assert_fail("Cudd_ReadSize(dd) == 2 * nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcAuto.c"
                    ,0x5b,"void Abc_NtkAutoPrint(Abc_Ntk_t *, int, int, int)");
    }
    Cudd_zddVarsFromBddVars(dd,2);
    if (Output == -1) {
      iVar6 = clock_gettime(3,&local_48);
      if (iVar6 < 0) {
        local_68 = 1;
      }
      else {
        lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        local_68 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      if ((int)uVar8 < 1) {
        local_9c = 0;
        local_a4 = 0;
        uVar4 = 0;
        local_a0 = 0;
        uVar5 = 0;
      }
      else {
        uVar17 = 0;
        uVar5 = 0;
        local_a0 = 0;
        uVar4 = 0;
        local_a4 = 0;
        local_9c = 0;
        do {
          pDVar13 = *(DdNode **)((long)pvVar11 + uVar17 * 8);
          pDVar13 = Extra_bddSpaceFromFunction(dd,pDVar13,pDVar13);
          Cudd_Ref(pDVar13);
          pDVar14 = Extra_bddSpaceCanonVars(dd,pDVar13);
          Cudd_Ref(pDVar14);
          pDVar15 = Extra_bddSpaceReduce(dd,*(DdNode **)((long)pvVar11 + uVar17 * 8),pDVar14);
          Cudd_Ref(pDVar15);
          pDVar16 = Extra_bddSpaceEquations(dd,pDVar13);
          Cudd_Ref(pDVar16);
          nvars = Cudd_SupportSize(dd,pDVar13);
          dVar23 = Cudd_CountMinterm(dd,pDVar13,nvars);
          uVar9 = Extra_Base2LogDouble(dVar23);
          printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",uVar17 & 0xffffffff,(ulong)nvars,
                 (ulong)uVar9);
          if (0 < (int)uVar9) {
            local_a0 = local_a0 + 1;
            local_9c = local_9c + uVar9;
            uVar10 = local_a4;
            if ((int)local_a4 <= (int)uVar9) {
              uVar10 = uVar9;
            }
            bVar3 = (int)local_a4 < (int)uVar9;
            local_a4 = uVar10;
            if (bVar3) {
              uVar4 = nvars;
            }
          }
          if ((int)uVar5 <= (int)nvars) {
            uVar5 = nvars;
          }
          n = Extra_bddSpaceFromMatrixPos(dd,pDVar16);
          Cudd_Ref(n);
          if (pDVar13 != n) {
            puts("Spaces are NOT EQUAL!");
          }
          Cudd_RecursiveDeref(dd,pDVar13);
          Cudd_RecursiveDeref(dd,n);
          Cudd_RecursiveDeref(dd,pDVar14);
          Cudd_RecursiveDeref(dd,pDVar15);
          Cudd_RecursiveDerefZdd(dd,pDVar16);
          uVar17 = uVar17 + 1;
        } while (uVar8 != uVar17);
      }
      puts("The cumulative statistics for all outputs:");
      printf("Ins=%3d ",(ulong)uVar7);
      printf("InMax=%3d   ",(ulong)uVar5);
      printf("Outs=%3d ",(ulong)uVar8);
      printf("Auto=%3d   ",(ulong)local_a0);
      printf("SumK=%3d ",(ulong)local_9c);
      printf("KMax=%2d ",(ulong)local_a4);
      printf("Supp=%3d   ",(ulong)uVar4);
      iVar6 = clock_gettime(3,&local_48);
      if (iVar6 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      printf("Time=%4.2f ",(double)((float)(lVar18 + local_68) / 1e+06));
      putchar(10);
    }
    else {
      pDVar13 = Extra_bddSpaceFromFunctionFast(dd,*(DdNode **)((long)pvVar11 + (long)Output * 8));
      Cudd_Ref(pDVar13);
      pDVar14 = Extra_bddSpaceCanonVars(dd,pDVar13);
      Cudd_Ref(pDVar14);
      pDVar15 = Extra_bddSpaceReduce(dd,*(DdNode **)((long)pvVar11 + (long)Output * 8),pDVar14);
      Cudd_Ref(pDVar15);
      pDVar16 = Extra_bddSpaceEquations(dd,pDVar13);
      Cudd_Ref(pDVar16);
      uVar7 = Cudd_SupportSize(dd,pDVar13);
      dVar23 = Cudd_CountMinterm(dd,pDVar13,uVar7);
      uVar8 = Extra_Base2LogDouble(dVar23);
      printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",Output,(ulong)uVar7,(ulong)uVar8);
      Cudd_RecursiveDeref(dd,pDVar13);
      Cudd_RecursiveDeref(dd,pDVar14);
      Cudd_RecursiveDeref(dd,pDVar15);
      Cudd_RecursiveDerefZdd(dd,pDVar16);
    }
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (local_38 != (char **)0x0) {
      free(local_38);
    }
    if (__ptr_00 != (char **)0x0) {
      free(__ptr_00);
    }
    if (pvVar11 != (void *)0x0) {
      free(pvVar11);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void Abc_NtkAutoPrint( Abc_Ntk_t * pNtk, int Output, int fNaive, int fVerbose )
{
    DdManager * dd;         // the BDD manager used to hold shared BDDs
    DdNode ** pbGlobal;     // temporary storage for global BDDs
    char ** pInputNames;    // pointers to the CI names
    char ** pOutputNames;   // pointers to the CO names
    int nOutputs, nInputs, i;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;

    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, 10000000, 1, 1, 0, fVerbose) == NULL )
        return;

    // get information about the network
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
//    dd       = pNtk->pManGlob;
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    pbGlobal = (DdNode **)Vec_PtrArray( vFuncsGlob );

    // get the network names
    pInputNames = Abc_NtkCollectCioNames( pNtk, 0 );
    pOutputNames = Abc_NtkCollectCioNames( pNtk, 1 );

    // print the size of the BDDs
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // allocate additional variables
    for ( i = 0; i < nInputs; i++ )
        Cudd_bddNewVar( dd );
    assert( Cudd_ReadSize(dd) == 2 * nInputs );

    // create ZDD variables in the manager
    Cudd_zddVarsFromBddVars( dd, 2 );

    // perform the analysis of the primary output functions for auto-symmetry
    if ( Output == -1 )
        Abc_NtkAutoPrintAll( dd, nInputs, pbGlobal, nOutputs, pInputNames, pOutputNames, fNaive );
    else
        Abc_NtkAutoPrintOne( dd, nInputs, pbGlobal, Output, pInputNames, pOutputNames, fNaive );

    // deref the PO functions
//    Abc_NtkFreeGlobalBdds( pNtk );
    // stop the global BDD manager
//    Extra_StopManager( pNtk->pManGlob );
//    pNtk->pManGlob = NULL;
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( pInputNames );
    ABC_FREE( pOutputNames );
    Vec_PtrFree( vFuncsGlob );
}